

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

vec2 __thiscall djb::tab_r::h2_to_u2_std_radial(tab_r *this,vec3 *wm,float_t zi,float_t param_3)

{
  vec2 vVar1;
  float fVar2;
  float u1;
  float fVar3;
  float_t fVar4;
  float_t fVar5;
  
  fVar3 = wm->z;
  fVar2 = 0.0;
  if (fVar3 < 1.0) {
    fVar2 = atan2f(wm->y,wm->x);
    fVar3 = wm->z;
  }
  u1 = (fVar2 / 3.1415927 + 1.0) * 0.5;
  fVar2 = 0.0;
  if (0.0 <= fVar3) {
    fVar2 = fVar3;
  }
  fVar3 = 1.0;
  if (fVar2 <= 1.0) {
    fVar3 = fVar2;
  }
  fVar3 = acosf(fVar3);
  fVar3 = fVar3 * 0.63661975;
  if (fVar3 < 0.0) {
    fVar4 = sqrtf(fVar3);
  }
  else {
    fVar4 = SQRT(fVar3);
  }
  fVar5 = cdf1(this,u1,zi);
  fVar4 = cdf2(this,fVar4,u1,zi);
  vVar1.y = fVar4;
  vVar1.x = fVar5;
  return vVar1;
}

Assistant:

vec2 tab_r::h2_to_u2_std_radial(const vec3 &wm, float_t zi, float_t) const
{
	float_t pm = wm.z < 1 ? atan2(wm.y, wm.x) : 0;
	float_t u1 = (pm / m_pi() + 1) / 2;
	float_t u2 = sqrt(acos(sat(wm.z)) * (2 / m_pi()));

	return vec2(cdf1(u1, zi), cdf2(u2, u1, zi));
}